

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrature.hpp
# Opt level: O2

void __thiscall
IntegratorXX::
Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Delley<double>>>
::
Quadrature<IntegratorXX::Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>>const&,IntegratorXX::Quadrature<IntegratorXX::Delley<double>>const&,std::array<double,3ul>const&,void>
          (Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,double>,IntegratorXX::TreutlerAhlrichsRadialTraits>,IntegratorXX::Delley<double>>>
           *this,Quadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>_>
                 *args,Quadrature<IntegratorXX::Delley<double>_> *args_1,array<double,_3UL> *args_2)

{
  _Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  local_40;
  
  quadrature_traits<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Delley<double>_>,_void>
  ::generate((tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
              *)&local_40,args,args_1,args_2);
  Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Delley<double>_>_>
  ::Quadrature((Quadrature<IntegratorXX::SphericalQuadrature<IntegratorXX::RadialTransformQuadrature<IntegratorXX::GaussChebyshev2<double,_double>,_IntegratorXX::TreutlerAhlrichsRadialTraits>,_IntegratorXX::Delley<double>_>_>
                *)this,(quadrature_return_type *)&local_40);
  std::
  _Tuple_impl<0UL,_std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
  ::~_Tuple_impl(&local_40);
  return;
}

Assistant:

Quadrature( Args&&... args ) :
    Quadrature( generate( std::forward<Args>(args)... ) ) { }